

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_dict_remove(void)

{
  int iVar1;
  VALUE *pVVar2;
  size_t sVar3;
  char key [32];
  int n_removed;
  int i;
  VALUE *v;
  VALUE d;
  int N;
  VALUE *in_stack_000003e0;
  VALUE *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  VALUE *in_stack_ffffffffffffffd0;
  int local_28;
  uint local_24;
  
  local_28 = 0;
  value_init_dict((VALUE *)0x10c5ee);
  for (local_24 = 0; (int)local_24 < 100000; local_24 = local_24 + 1) {
    sprintf(&stack0xffffffffffffffb8,"%d",(ulong)local_24);
    pVVar2 = value_dict_get_or_add(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    acutest_check_((int)(ulong)(pVVar2 != (VALUE *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x363,"%s","v != NULL");
    value_init_int32(in_stack_ffffffffffffffb8,0);
  }
  iVar1 = value_dict_verify(in_stack_ffffffffffffffb8);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x366,"%s","value_dict_verify(&d) == 0");
  for (local_24 = 0; (int)local_24 < 100000; local_24 = local_24 + 0x11) {
    sprintf(&stack0xffffffffffffffb8,"%d",(ulong)local_24);
    iVar1 = value_dict_remove(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    acutest_check_((int)(ulong)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x36a,"%s","value_dict_remove(&d, key) == 0");
    local_28 = local_28 + 1;
  }
  iVar1 = value_dict_remove(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x36d,"%s","value_dict_remove(&d, \"n/a\") != 0");
  sVar3 = value_dict_size(in_stack_ffffffffffffffb8);
  acutest_check_((int)(ulong)(sVar3 == (long)(100000 - local_28)),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x36f,"%s","value_dict_size(&d) == N - n_removed");
  for (local_24 = 0; (int)local_24 < 100000; local_24 = local_24 + 1) {
    sprintf(&stack0xffffffffffffffb8,"%d",(ulong)local_24);
    pVVar2 = value_dict_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if ((int)local_24 % 0x11 == 0) {
      acutest_check_((int)(ulong)(pVVar2 == (VALUE *)0x0),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                     ,0x375,"%s","v == NULL");
    }
    else {
      acutest_check_((int)(ulong)(pVVar2 != (VALUE *)0x0),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                     ,0x377,"%s","v != NULL");
    }
  }
  value_dict_clean(in_stack_000003e0);
  sVar3 = value_dict_size(in_stack_ffffffffffffffb8);
  acutest_check_((int)(ulong)(sVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x37b,"%s","value_dict_size(&d) == 0");
  value_fini((VALUE *)0x10c8c9);
  return;
}

Assistant:

static void
test_dict_remove(void)
{
    const int N = 100000;

    VALUE d;
    VALUE* v;
    int i;
    int n_removed = 0;
    char key[32];

    value_init_dict(&d);
    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get_or_add(&d, key);
        TEST_CHECK(v != NULL);
        value_init_int32(v, i);
    }
    TEST_CHECK(value_dict_verify(&d) == 0);

    for(i = 0; i < N; i += 17) {
        sprintf(key, "%d", i);
        TEST_CHECK(value_dict_remove(&d, key) == 0);
        n_removed++;
    }
    TEST_CHECK(value_dict_remove(&d, "n/a") != 0);

    TEST_CHECK(value_dict_size(&d) == N - n_removed);

    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get(&d, key);
        if(i % 17 == 0)
            TEST_CHECK(v == NULL);
        else
            TEST_CHECK(v != NULL);
    }

    value_dict_clean(&d);
    TEST_CHECK(value_dict_size(&d) == 0);
    value_fini(&d);
}